

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

string * module_for_header(string *__return_storage_ptr__,string *header)

{
  bool bVar1;
  __type _Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  string module;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&s_header_map_abi_cxx11_._M_t,header);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &s_header_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(iVar3._M_node + 2));
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&module,(ulong)header);
  bVar1 = std::operator==(&module,"libs/");
  std::__cxx11::string::~string((string *)&module);
  if (!bVar1) {
    std::__cxx11::string::substr((ulong)&module,(ulong)header);
    bVar1 = std::operator==(&module,"test/");
    std::__cxx11::string::~string((string *)&module);
    if (!bVar1) goto LAB_0010bb02;
  }
  std::__cxx11::string::substr((ulong)&module,(ulong)header);
  std::__cxx11::string::operator=((string *)header,(string *)&module);
  std::__cxx11::string::~string((string *)&module);
  for (p_Var4 = s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::__cxx11::string::string((string *)&module,(string *)(p_Var4 + 1));
    local_70._M_dataplus._M_p._0_1_ = 0x7e;
    local_50._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )module._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(module._M_dataplus._M_p + module._M_string_length),(char *)&local_70,
               (char *)&local_50);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)header);
    std::operator+(&local_50,&module,'/');
    _Var2 = std::operator==(&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(p_Var4 + 1));
      std::__cxx11::string::~string((string *)&module);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)&module);
  }
LAB_0010bb02:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string module_for_header( std::string header )
{
    {
        std::map<std::string, std::string>::const_iterator i = s_header_map.find( header );

        if( i != s_header_map.end() )
        {
            return i->second;
        }
    }

    if( header.substr( 0, 5 ) == "libs/" )
    {
        header = header.substr( 5 );
    }
    else if( header.substr( 0, 5 ) == "test/" )
    {
        header = header.substr( 5 );
    }
    else
    {
        return std::string();
    }

    for( std::set<std::string>::const_iterator i = s_modules.begin(); i != s_modules.end(); ++i )
    {
        std::string module = *i;
        std::replace( module.begin(), module.end(), '~', '/' );

        if( header.substr( 0, module.size() + 1 ) == module + '/' )
        {
            return *i;
        }
    }

    return std::string();
}